

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  second_type pEVar1;
  undefined8 uVar2;
  pointer this_00;
  EnumValueDescriptor *pEVar3;
  string *psVar4;
  EnumValueOptions *value;
  uint in_EDX;
  EnumDescriptor *in_RSI;
  long in_RDI;
  pair<const_google::protobuf::EnumDescriptor_*,_int> pVar5;
  EnumValueDescriptor *result;
  Tables *tables;
  string enum_value_name;
  EnumValueDescriptor *desc_2;
  WriterMutexLock l_1;
  EnumValueDescriptor *desc_1;
  ReaderMutexLock l;
  EnumValueDescriptor *desc;
  Mutex *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe28;
  Tables *in_stack_fffffffffffffe30;
  string local_130 [32];
  string local_110 [8];
  string local_e0 [32];
  EnumDescriptor *local_c0;
  int local_b8;
  EnumDescriptor *local_b0;
  int local_a8;
  second_type local_a0;
  uint local_8c;
  EnumDescriptor *local_88;
  int local_80;
  EnumDescriptor *local_68;
  int local_60;
  second_type local_58;
  EnumDescriptor *local_48;
  int local_40;
  EnumDescriptor *local_38;
  int local_30;
  second_type local_28;
  uint local_1c;
  EnumDescriptor *local_18;
  second_type local_8;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  pVar5 = std::make_pair<google::protobuf::EnumDescriptor_const*&,int&>
                    ((EnumDescriptor **)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     (int *)in_stack_fffffffffffffe08);
  local_48 = pVar5.first;
  local_40 = pVar5.second;
  local_38 = local_48;
  local_30 = local_40;
  local_28 = FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                       ((unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                         *)in_stack_fffffffffffffe18,
                        (first_type *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10))
  ;
  pEVar1 = local_28;
  if (local_28 == (second_type)0x0) {
    internal::MutexLock::MutexLock
              ((MutexLock *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08);
    pVar5 = std::make_pair<google::protobuf::EnumDescriptor_const*&,int&>
                      ((EnumDescriptor **)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       (int *)in_stack_fffffffffffffe08);
    local_88 = pVar5.first;
    local_80 = pVar5.second;
    local_68 = local_88;
    local_60 = local_80;
    local_58 = FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                         ((unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                           *)in_stack_fffffffffffffe18,
                          (first_type *)
                          CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    if (local_58 != (second_type)0x0) {
      local_8 = local_58;
    }
    local_8c = (uint)(local_58 != (second_type)0x0);
    internal::MutexLock::~MutexLock((MutexLock *)0x4dae7e);
    pEVar1 = local_8;
    if (local_8c == 0) {
      internal::MutexLock::MutexLock
                ((MutexLock *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08);
      pVar5 = std::make_pair<google::protobuf::EnumDescriptor_const*&,int&>
                        ((EnumDescriptor **)
                         CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         (int *)in_stack_fffffffffffffe08);
      local_c0 = pVar5.first;
      local_b8 = pVar5.second;
      local_b0 = local_c0;
      local_a8 = local_b8;
      local_a0 = FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                           ((unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                             *)in_stack_fffffffffffffe18,
                            (first_type *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      if (local_a0 == (second_type)0x0) {
        EnumDescriptor::name_abi_cxx11_(local_18);
        uVar2 = std::__cxx11::string::c_str();
        StringPrintf_abi_cxx11_((char *)local_e0,"UNKNOWN_ENUM_VALUE_%s_%d",uVar2,(ulong)local_1c);
        DescriptorPool::generated_pool();
        this_00 = std::
                  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  ::get((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                         *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        pEVar3 = DescriptorPool::Tables::Allocate<google::protobuf::EnumValueDescriptor>
                           ((Tables *)0x4dafee);
        psVar4 = DescriptorPool::Tables::AllocateString
                           (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        *(string **)pEVar3 = psVar4;
        psVar4 = EnumDescriptor::full_name_abi_cxx11_(local_18);
        std::operator+(psVar4,(char *)this_00);
        std::operator+(in_stack_fffffffffffffe18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        psVar4 = DescriptorPool::Tables::AllocateString(this_00,in_stack_fffffffffffffe28);
        *(string **)(pEVar3 + 8) = psVar4;
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_130);
        *(uint *)(pEVar3 + 0x10) = local_1c;
        *(EnumDescriptor **)(pEVar3 + 0x18) = local_18;
        value = EnumValueOptions::default_instance();
        *(EnumValueOptions **)(pEVar3 + 0x20) = value;
        std::make_pair<google::protobuf::EnumDescriptor_const*&,int&>
                  ((EnumDescriptor **)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (int *)(in_RDI + 0x138));
        InsertIfNotPresent<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                  ((unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                    *)this_00,(first_type *)psVar4,(second_type *)value);
        local_8c = 1;
        local_8 = pEVar3;
        std::__cxx11::string::~string(local_e0);
      }
      else {
        local_8c = 1;
        local_8 = local_a0;
      }
      internal::MutexLock::~MutexLock((MutexLock *)0x4db233);
      pEVar1 = local_8;
    }
  }
  local_8 = pEVar1;
  return local_8;
}

Assistant:

inline const EnumValueDescriptor*
FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown(
    const EnumDescriptor* parent, int number) const {
  // First try, with map of compiled-in values.
  {
    const EnumValueDescriptor* desc = FindPtrOrNull(
        enum_values_by_number_, std::make_pair(parent, number));
    if (desc != nullptr) {
      return desc;
    }
  }
  // Second try, with reader lock held on unknown enum values: common case.
  {
    ReaderMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != nullptr) {
      return desc;
    }
  }
  // If not found, try again with writer lock held, and create new descriptor if
  // necessary.
  {
    WriterMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != nullptr) {
      return desc;
    }

    // Create an EnumValueDescriptor dynamically. We don't insert it into the
    // EnumDescriptor (it's not a part of the enum as originally defined), but
    // we do insert it into the table so that we can return the same pointer
    // later.
    std::string enum_value_name = StringPrintf("UNKNOWN_ENUM_VALUE_%s_%d",
                                               parent->name().c_str(), number);
    DescriptorPool::Tables* tables = const_cast<DescriptorPool::Tables*>(
        DescriptorPool::generated_pool()->tables_.get());
    EnumValueDescriptor* result = tables->Allocate<EnumValueDescriptor>();
    result->name_ = tables->AllocateString(enum_value_name);
    result->full_name_ =
        tables->AllocateString(parent->full_name() + "." + enum_value_name);
    result->number_ = number;
    result->type_ = parent;
    result->options_ = &EnumValueOptions::default_instance();
    InsertIfNotPresent(&unknown_enum_values_by_number_,
                            std::make_pair(parent, number), result);
    return result;
  }
}